

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O1

OggOpusFile *
op_open_callbacks(void *_stream,OpusFileCallbacks *_cb,uchar *_initial_data,size_t _initial_bytes,
                 int *_error)

{
  int iVar1;
  OggOpusFile *_of;
  
  _of = op_test_callbacks(_stream,_cb,_initial_data,_initial_bytes,_error);
  if (_of != (OggOpusFile *)0x0) {
    iVar1 = op_open2(_of);
    if (-1 < iVar1) {
      return _of;
    }
    if (_error != (int *)0x0) {
      *_error = iVar1;
    }
    free(_of);
  }
  return (OggOpusFile *)0x0;
}

Assistant:

OggOpusFile *op_open_callbacks(void *_stream,const OpusFileCallbacks *_cb,
 const unsigned char *_initial_data,size_t _initial_bytes,int *_error){
  OggOpusFile *of;
  of=op_test_callbacks(_stream,_cb,_initial_data,_initial_bytes,_error);
  if(OP_LIKELY(of!=NULL)){
    int ret;
    ret=op_open2(of);
    if(OP_LIKELY(ret>=0))return of;
    if(_error!=NULL)*_error=ret;
    _ogg_free(of);
  }
  return NULL;
}